

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

int exr_attr_opaquedata_init(exr_context_t ctxt,exr_attr_opaquedata_t *u,size_t b)

{
  int iVar1;
  undefined8 uVar2;
  ulong in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  exr_attr_opaquedata_t nil;
  undefined1 auStack_58 [56];
  ulong local_20;
  undefined4 *local_18;
  long local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(auStack_58,0,0x38);
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_18 == (undefined4 *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to opaque data object to initialize");
  }
  else if (local_20 < 0x80000000) {
    memcpy(local_18,auStack_58,0x38);
    if (local_20 != 0) {
      uVar2 = (**(code **)(local_10 + 0x58))(local_20);
      *(undefined8 *)(local_18 + 4) = uVar2;
      if (*(long *)(local_18 + 4) == 0) {
        iVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
        return iVar1;
      }
    }
    *local_18 = (int)local_20;
    local_18[2] = (int)local_20;
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)"
                         ,local_20);
  }
  return local_4;
}

Assistant:

int
exr_attr_opaquedata_init (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, size_t b)
{
    exr_attr_opaquedata_t nil = {0};

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!u)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to opaque data object to initialize");

    if (b > (size_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size for opaque data (%" PRIu64
            " bytes, must be <= INT32_MAX)",
            (uint64_t) b);

    *u = nil;
    if (b > 0)
    {

        u->packed_data = ctxt->alloc_fn (b);
        if (!u->packed_data)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
    }
    u->size              = (int32_t) b;
    u->packed_alloc_size = (int32_t) b;
    return EXR_ERR_SUCCESS;
}